

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__dup2_cloexec(int oldfd,int newfd)

{
  int *piVar1;
  int r;
  int newfd_local;
  int oldfd_local;
  
  newfd_local = dup3(oldfd,newfd,0x80000);
  if (newfd_local == -1) {
    piVar1 = __errno_location();
    newfd_local = -*piVar1;
  }
  return newfd_local;
}

Assistant:

int uv__dup2_cloexec(int oldfd, int newfd) {
#if defined(__FreeBSD__) || defined(__NetBSD__) || defined(__linux__)
  int r;

  r = dup3(oldfd, newfd, O_CLOEXEC);
  if (r == -1)
    return UV__ERR(errno);

  return r;
#else
  int err;
  int r;

  r = dup2(oldfd, newfd);  /* Never retry. */
  if (r == -1)
    return UV__ERR(errno);

  err = uv__cloexec(newfd, 1);
  if (err != 0) {
    uv__close(newfd);
    return err;
  }

  return r;
#endif
}